

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddCacheDefinition
          (cmMakefile *this,string *name,char *value,char *doc,CacheEntryType type,bool force)

{
  pointer pcVar1;
  char *pcVar2;
  bool bVar3;
  CacheEntryType CVar4;
  PolicyStatus PVar5;
  cmValue cVar6;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  ulong uVar7;
  char *__s;
  long lVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string nvalue;
  undefined1 local_e8 [40];
  char *local_c0;
  char *local_b8;
  char local_b0;
  undefined7 uStack_af;
  char *local_a0;
  ulong local_98;
  string local_90;
  undefined1 local_70 [32];
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_a0 = doc;
  cVar6 = cmState::GetInitializedCacheValue
                    ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
  local_c0 = &local_b0;
  local_b8 = (char *)0x0;
  local_b0 = '\0';
  if ((cVar6.Value != (string *)0x0) &&
     (CVar4 = cmState::GetCacheEntryType
                        ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name),
     pcVar2 = local_b8, CVar4 == UNINITIALIZED)) {
    if (!force) {
      value = ((cVar6.Value)->_M_dataplus)._M_p;
    }
    if (type - PATH < 2) {
      local_e8._0_8_ = (pointer)0x0;
      local_e8._8_8_ = (pointer)0x0;
      local_e8._16_8_ = (pointer)0x0;
      __s = "";
      if (value != (pointer)0x0) {
        __s = value;
      }
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_c0,0,pcVar2,(ulong)__s);
      arg._M_str = local_c0;
      arg._M_len = (size_t)local_b8;
      cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_e8,false);
      local_b8 = (char *)0x0;
      local_98 = (ulong)type;
      *local_c0 = '\0';
      if (local_e8._8_8_ != local_e8._0_8_) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          value_00._M_str = *(char **)(local_e8._0_8_ + lVar8);
          value_00._M_len = *(size_t *)(local_e8._0_8_ + lVar8 + 8);
          bVar3 = cmValue::IsOff(value_00);
          if (!bVar3) {
            cmsys::SystemTools::CollapseFullPath
                      ((string *)local_70,(string *)(local_e8._0_8_ + lVar8));
            std::__cxx11::string::operator=((string *)(local_e8._0_8_ + lVar8),(string *)local_70);
            if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
              operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
            }
          }
          if (uVar7 != 0) {
            std::__cxx11::string::append((char *)&local_c0);
          }
          std::__cxx11::string::_M_append((char *)&local_c0,*(ulong *)(local_e8._0_8_ + lVar8));
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar7 < (ulong)((long)(local_e8._8_8_ - local_e8._0_8_) >> 5));
      }
      type = (CacheEntryType)local_98;
      cmake::AddCacheEntry
                (this->GlobalGenerator->CMakeInstance,name,(string *)&local_c0,local_a0,type);
      cmState::GetInitializedCacheValue
                ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
      std::__cxx11::string::_M_assign((string *)&local_c0);
      value = local_c0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8);
    }
  }
  cmake::AddCacheEntry(this->GlobalGenerator->CMakeInstance,name,value,local_a0,type);
  PVar5 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0126,false);
  if (PVar5 != OLD) {
    if (PVar5 != WARN) goto LAB_001afc62;
    pcVar1 = local_70 + 0x10;
    local_70._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"CMAKE_POLICY_WARNING_CMP0126","");
    bVar3 = PolicyOptionalWarningEnabled(this,(string *)local_70);
    if (bVar3) {
      bVar3 = IsNormalDefinitionSet(this,name);
      id = extraout_EDX;
      if ((pointer)local_70._0_8_ != pcVar1) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        id = extraout_EDX_00;
      }
      if (bVar3) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_90,(cmPolicies *)0x7e,id);
        local_70._0_8_ = local_90._M_string_length;
        local_70._8_8_ = local_90._M_dataplus._M_p;
        local_70._16_8_ = 0x42;
        local_70._24_8_ = "\nFor compatibility with older versions of CMake, normal variable \"";
        local_48 = (name->_M_dataplus)._M_p;
        local_50 = name->_M_string_length;
        local_40 = 0x29;
        local_38 = "\" will be removed from the current scope.";
        views._M_len = 4;
        views._M_array = (iterator)local_70;
        cmCatViews_abi_cxx11_((string *)local_e8,views);
        cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,(string *)local_e8,
                            &this->Backtrace);
        if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_001afc4f;
      }
    }
    else {
      local_90.field_2._M_allocated_capacity = local_70._16_8_;
      local_90._M_dataplus._M_p = (pointer)local_70._0_8_;
      if ((pointer)local_70._0_8_ != pcVar1) {
LAB_001afc4f:
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
LAB_001afc62:
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return;
}

Assistant:

void cmMakefile::AddCacheDefinition(const std::string& name, const char* value,
                                    const char* doc,
                                    cmStateEnums::CacheEntryType type,
                                    bool force)
{
  cmValue existingValue = this->GetState()->GetInitializedCacheValue(name);
  // must be outside the following if() to keep it alive long enough
  std::string nvalue;

  if (existingValue &&
      (this->GetState()->GetCacheEntryType(name) ==
       cmStateEnums::UNINITIALIZED)) {
    // if this is not a force, then use the value from the cache
    // if it is a force, then use the value being passed in
    if (!force) {
      value = existingValue->c_str();
    }
    if (type == cmStateEnums::PATH || type == cmStateEnums::FILEPATH) {
      std::vector<std::string>::size_type cc;
      std::vector<std::string> files;
      nvalue = value ? value : "";

      cmExpandList(nvalue, files);
      nvalue.clear();
      for (cc = 0; cc < files.size(); cc++) {
        if (!cmIsOff(files[cc])) {
          files[cc] = cmSystemTools::CollapseFullPath(files[cc]);
        }
        if (cc > 0) {
          nvalue += ";";
        }
        nvalue += files[cc];
      }

      this->GetCMakeInstance()->AddCacheEntry(name, nvalue, doc, type);
      nvalue = *this->GetState()->GetInitializedCacheValue(name);
      value = nvalue.c_str();
    }
  }
  this->GetCMakeInstance()->AddCacheEntry(name, value, doc, type);
  switch (this->GetPolicyStatus(cmPolicies::CMP0126)) {
    case cmPolicies::WARN:
      if (this->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0126") &&
          this->IsNormalDefinitionSet(name)) {
        this->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0126),
                   "\nFor compatibility with older versions of CMake, normal "
                   "variable \"",
                   name, "\" will be removed from the current scope."));
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // if there was a definition then remove it
      this->StateSnapshot.RemoveDefinition(name);
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      break;
  }
}